

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

QRegion __thiscall QPainter::clipRegion(QPainter *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var5;
  FillRule FVar6;
  TransformationType TVar7;
  QTransform *pQVar8;
  long lVar9;
  bool bVar10;
  long *in_RSI;
  qreal *pqVar11;
  QTransform *pQVar12;
  QRegion *pQVar13;
  long lVar14;
  QTransform *m;
  QRect *r;
  QRectF *this_00;
  QPainterPath *this_01;
  long in_FS_OFFSET;
  byte bVar15;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  QTransform local_d8;
  QTransform matrix;
  
  bVar15 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *in_RSI;
  if (*(long *)(lVar3 + 0x118) == 0) {
    matrix.m_matrix[0][0]._0_4_ = 2;
    matrix.m_matrix[0][2]._4_4_ = 0;
    matrix.m_matrix[0]._4_8_ = 0;
    matrix.m_matrix[0]._12_8_ = 0;
    matrix.m_matrix[1][0] = (qreal)((long)"x-default" + 2);
    QMessageLogger::warning((char *)&matrix,"QPainter::clipRegion: Painter not active");
    QRegion::QRegion((QRegion *)this);
  }
  else {
    (this->d_ptr)._M_t.super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>
    ._M_t.super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
    super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
         (QPainterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    if ((*(byte *)(lVar3 + 0xf8) & 1) == 0) {
      QPainterPrivate::updateInvMatrix((QPainterPrivate *)*in_RSI);
    }
    lVar4 = *(long *)(*(long *)(lVar3 + 0x40) + 0x78);
    m = (QTransform *)(lVar3 + 0xa8);
    lVar3 = *(long *)(*(long *)(lVar3 + 0x40) + 0x80);
    bVar10 = true;
    for (lVar14 = 0; lVar3 * 0xa0 != lVar14; lVar14 = lVar14 + 0xa0) {
      if (3 < *(uint *)(lVar4 + lVar14)) goto LAB_00385ea2;
      pQVar8 = (QTransform *)(lVar4 + lVar14 + 8);
      switch(*(uint *)(lVar4 + lVar14)) {
      case 0:
        pqVar11 = (qreal *)&DAT_005ee258;
        pQVar12 = &matrix;
        for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
          pQVar12->m_matrix[0][0] = *pqVar11;
          pqVar11 = pqVar11 + (ulong)bVar15 * -2 + 1;
          pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        }
        QTransform::operator*(&matrix,pQVar8,m);
        if (bVar10) {
          QTransform::map(&local_d8,(QRegion *)&matrix);
          _Var5._M_head_impl =
               (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
               super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
               super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
          (this->d_ptr)._M_t.
          super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
          super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
               (QPainterPrivate *)local_d8.m_matrix[0][0];
          local_d8.m_matrix[0][0] = (qreal)_Var5._M_head_impl;
          QRegion::~QRegion((QRegion *)&local_d8);
          bVar10 = false;
        }
        else {
          iVar1 = *(int *)(lVar4 + 0x58 + lVar14);
          if (iVar1 == 0) {
            QRegion::QRegion((QRegion *)&local_d8);
            _Var5._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_d8.m_matrix[0][0];
            local_d8.m_matrix[0][0] = (qreal)_Var5._M_head_impl;
            QRegion::~QRegion((QRegion *)&local_d8);
            bVar10 = true;
          }
          else {
            if (iVar1 == 2) {
              QTransform::map(&local_d8,(QRegion *)&matrix);
              QRegion::operator&=((QRegion *)this,(QRegion *)&local_d8);
            }
            else {
              QTransform::map(&local_d8,(QRegion *)&matrix);
              _Var5._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_d8.m_matrix[0][0];
              local_d8.m_matrix[0][0] = (qreal)_Var5._M_head_impl;
            }
            QRegion::~QRegion((QRegion *)&local_d8);
          }
        }
        break;
      case 1:
        pqVar11 = (qreal *)&DAT_005ee258;
        pQVar12 = &matrix;
        for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
          pQVar12->m_matrix[0][0] = *pqVar11;
          pqVar11 = pqVar11 + (ulong)bVar15 * -2 + 1;
          pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        }
        QTransform::operator*(&matrix,pQVar8,m);
        this_01 = (QPainterPath *)(lVar4 + lVar14 + 0x60);
        if (bVar10) {
          QTransform::map((QTransform *)local_118,(QPainterPath *)&matrix);
          pqVar11 = (qreal *)&DAT_005ee210;
          pQVar8 = &local_d8;
          for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
            pQVar8->m_matrix[0][0] = *pqVar11;
            pqVar11 = pqVar11 + (ulong)bVar15 * -2 + 1;
            pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar15 * -2 + 1) * 8);
          }
          local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
          QPainterPath::toFillPolygon
                    ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
          QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
          FVar6 = QPainterPath::fillRule(this_01);
          QRegion::QRegion((QRegion *)(local_f8 + 0x18),(QPolygon *)local_f8,FVar6);
          _Var5._M_head_impl =
               (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
               super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
               super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
          (this->d_ptr)._M_t.
          super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
          super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
               (QPainterPrivate *)local_f8._24_8_;
          local_f8._24_8_ = _Var5._M_head_impl;
          QRegion::~QRegion((QRegion *)(local_f8 + 0x18));
          QArrayDataPointer<QPoint>::~QArrayDataPointer((QArrayDataPointer<QPoint> *)local_f8);
          QArrayDataPointer<QPointF>::~QArrayDataPointer
                    ((QArrayDataPointer<QPointF> *)(local_118 + 8));
          QPainterPath::~QPainterPath((QPainterPath *)local_118);
          bVar10 = false;
        }
        else {
          iVar1 = *(int *)(lVar4 + 0x58 + lVar14);
          if (iVar1 == 0) {
LAB_00385c18:
            QRegion::QRegion((QRegion *)&local_d8);
LAB_00385c39:
            _Var5._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_d8.m_matrix[0][0];
            local_d8.m_matrix[0][0] = (qreal)_Var5._M_head_impl;
            QRegion::~QRegion((QRegion *)&local_d8);
            bVar10 = true;
          }
          else {
            if (iVar1 == 2) {
              QTransform::map((QTransform *)local_118,(QPainterPath *)&matrix);
              pqVar11 = (qreal *)&DAT_005ee210;
              pQVar8 = &local_d8;
              for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
                pQVar8->m_matrix[0][0] = *pqVar11;
                pqVar11 = pqVar11 + (ulong)bVar15 * -2 + 1;
                pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar15 * -2 + 1) * 8);
              }
              local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
              QPainterPath::toFillPolygon
                        ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
              QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
              FVar6 = QPainterPath::fillRule(this_01);
              pQVar13 = (QRegion *)(local_f8 + 0x18);
              QRegion::QRegion(pQVar13,(QPolygon *)local_f8,FVar6);
              QRegion::operator&=((QRegion *)this,pQVar13);
              QRegion::~QRegion(pQVar13);
              QArrayDataPointer<QPoint>::~QArrayDataPointer((QArrayDataPointer<QPoint> *)local_f8);
            }
            else {
              QTransform::map((QTransform *)local_118,(QPainterPath *)&matrix);
              pqVar11 = (qreal *)&DAT_005ee210;
              pQVar8 = &local_d8;
              for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
                pQVar8->m_matrix[0][0] = *pqVar11;
                pqVar11 = pqVar11 + (ulong)bVar15 * -2 + 1;
                pQVar8 = (QTransform *)((long)pQVar8 + ((ulong)bVar15 * -2 + 1) * 8);
              }
              local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
              QPainterPath::toFillPolygon
                        ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
              QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
              FVar6 = QPainterPath::fillRule(this_01);
              QRegion::QRegion((QRegion *)(local_f8 + 0x18),(QPolygon *)local_f8,FVar6);
              _Var5._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_f8._24_8_;
              local_f8._24_8_ = _Var5._M_head_impl;
              QRegion::~QRegion((QRegion *)(local_f8 + 0x18));
              QArrayDataPointer<QPoint>::~QArrayDataPointer((QArrayDataPointer<QPoint> *)local_f8);
            }
            QArrayDataPointer<QPointF>::~QArrayDataPointer
                      ((QArrayDataPointer<QPointF> *)(local_118 + 8));
            QPainterPath::~QPainterPath((QPainterPath *)local_118);
          }
        }
        break;
      case 2:
        pqVar11 = (qreal *)&DAT_005ee258;
        pQVar12 = &matrix;
        for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
          pQVar12->m_matrix[0][0] = *pqVar11;
          pqVar11 = pqVar11 + (ulong)bVar15 * -2 + 1;
          pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        }
        QTransform::operator*(&matrix,pQVar8,m);
        r = (QRect *)(lVar4 + lVar14 + 0x70);
        if (bVar10) {
          pQVar13 = (QRegion *)local_f8;
          QRegion::QRegion(pQVar13,r,Rectangle);
          QTransform::map(&local_d8,(QRegion *)&matrix);
          _Var5._M_head_impl =
               (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
               super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
               super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
          (this->d_ptr)._M_t.
          super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
          super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
               (QPainterPrivate *)local_d8.m_matrix[0][0];
          local_d8.m_matrix[0][0] = (qreal)_Var5._M_head_impl;
          QRegion::~QRegion((QRegion *)&local_d8);
          bVar10 = false;
        }
        else {
          iVar1 = *(int *)(lVar4 + 0x58 + lVar14);
          if (iVar1 == 0) {
            QRegion::QRegion((QRegion *)&local_d8);
            goto LAB_00385c39;
          }
          if (iVar1 == 2) {
            TVar7 = QTransform::type(&matrix);
            if ((int)TVar7 < 3) {
              local_d8.m_matrix[0]._0_16_ = QTransform::mapRect(&matrix,r);
LAB_00385b14:
              QRegion::operator&=((QRegion *)this,(QRect *)&local_d8);
              break;
            }
            QRegion::QRegion((QRegion *)local_f8,r,Rectangle);
            QTransform::map(&local_d8,(QRegion *)&matrix);
            QRegion::operator&=((QRegion *)this,(QRegion *)&local_d8);
          }
          else {
            QRegion::QRegion((QRegion *)local_f8,r,Rectangle);
            QTransform::map(&local_d8,(QRegion *)&matrix);
            _Var5._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_d8.m_matrix[0][0];
            local_d8.m_matrix[0][0] = (qreal)_Var5._M_head_impl;
          }
          pQVar13 = (QRegion *)local_f8;
          QRegion::~QRegion((QRegion *)&local_d8);
        }
        goto LAB_00385e99;
      case 3:
        pqVar11 = (qreal *)&DAT_005ee258;
        pQVar12 = &matrix;
        for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
          pQVar12->m_matrix[0][0] = *pqVar11;
          pqVar11 = pqVar11 + (ulong)bVar15 * -2 + 1;
          pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        }
        QTransform::operator*(&matrix,pQVar8,m);
        this_00 = (QRectF *)(lVar4 + lVar14 + 0x80);
        if (bVar10) {
          local_d8.m_matrix[0]._0_16_ = QRectF::toRect(this_00);
          QRegion::QRegion((QRegion *)(local_118 + 8),(QRect *)&local_d8,Rectangle);
          QTransform::map((QTransform *)local_f8,(QRegion *)&matrix);
          _Var5._M_head_impl =
               (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
               super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
               super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
          (this->d_ptr)._M_t.
          super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
          super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
          super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
               (QPainterPrivate *)local_f8._0_8_;
          local_f8._0_8_ = _Var5._M_head_impl;
          bVar10 = false;
          QRegion::~QRegion((QRegion *)local_f8);
        }
        else {
          iVar1 = *(int *)(lVar4 + 0x58 + lVar14);
          if (iVar1 == 0) goto LAB_00385c18;
          if (iVar1 == 2) {
            TVar7 = QTransform::type(&matrix);
            if ((int)TVar7 < 3) {
              local_f8._0_16_ = (undefined1  [16])QRectF::toRect(this_00);
              local_d8.m_matrix[0]._0_16_ = QTransform::mapRect(&matrix,(QRect *)local_f8);
              goto LAB_00385b14;
            }
            local_d8.m_matrix[0]._0_16_ = QRectF::toRect(this_00);
            QRegion::QRegion((QRegion *)(local_118 + 8),(QRect *)&local_d8,Rectangle);
            QTransform::map((QTransform *)local_f8,(QRegion *)&matrix);
            QRegion::operator&=((QRegion *)this,(QRegion *)local_f8);
          }
          else {
            local_d8.m_matrix[0]._0_16_ = QRectF::toRect(this_00);
            QRegion::QRegion((QRegion *)(local_118 + 8),(QRect *)&local_d8,Rectangle);
            QTransform::map((QTransform *)local_f8,(QRegion *)&matrix);
            _Var5._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_f8._0_8_;
            local_f8._0_8_ = _Var5._M_head_impl;
          }
          QRegion::~QRegion((QRegion *)local_f8);
        }
        pQVar13 = (QRegion *)(local_118 + 8);
LAB_00385e99:
        QRegion::~QRegion(pQVar13);
      }
LAB_00385ea2:
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QPainter::clipRegion() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::clipRegion: Painter not active");
        return QRegion();
    }

    QRegion region;
    bool lastWasNothing = true;

    if (!d->txinv)
        const_cast<QPainter *>(this)->d_ptr->updateInvMatrix();

    // ### Falcon: Use QPainterPath
    for (const QPainterClipInfo &info : std::as_const(d->state->clipInfo)) {
        switch (info.clipType) {

        case QPainterClipInfo::RegionClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = info.region * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip)
                region &= info.region * matrix;
            else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else
                region = info.region * matrix;
            break;
        }

        case QPainterClipInfo::PathClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                 info.path.fillRule());
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                region &= QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                  info.path.fillRule());
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                 info.path.fillRule());
            }
            break;
        }

        case QPainterClipInfo::RectClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion(info.rect) * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                // Use rect intersection if possible.
                if (matrix.type() <= QTransform::TxScale)
                    region &= matrix.mapRect(info.rect);
                else
                    region &= matrix.map(QRegion(info.rect));
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion(info.rect) * matrix;
            }
            break;
        }

        case QPainterClipInfo::RectFClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion(info.rectf.toRect()) * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                // Use rect intersection if possible.
                if (matrix.type() <= QTransform::TxScale)
                    region &= matrix.mapRect(info.rectf.toRect());
                else
                    region &= matrix.map(QRegion(info.rectf.toRect()));
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion(info.rectf.toRect()) * matrix;
            }
            break;
        }
        }
    }

    return region;
}